

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O1

BCPos debug_framepc(lua_State *L,GCfunc *fn,cTValue *nextframe)

{
  long lVar1;
  uint uVar2;
  ulong in_RCX;
  ulong uVar3;
  cTValue *pcVar4;
  bool bVar5;
  
  if ((fn->c).ffid != '\0') {
    return 0xffffffff;
  }
  if (nextframe == (cTValue *)0x0) {
    uVar3 = (ulong)L->cframe & 0xfffffffffffffffc;
    if (uVar3 == 0) goto LAB_0011419f;
    in_RCX = *(ulong *)(uVar3 + 0x18);
    bVar5 = in_RCX == *(ulong *)(uVar3 + 0x10);
LAB_00114110:
    bVar5 = !bVar5;
  }
  else {
    in_RCX = nextframe->u64;
    if ((in_RCX & 3) == 0) goto LAB_001141a9;
    if (((uint)in_RCX & 7) == 2) {
      in_RCX = nextframe[-2].u64;
      goto LAB_001141a9;
    }
    in_RCX = (ulong)L->cframe & 0xfffffffffffffffc;
    if (in_RCX != 0) {
      pcVar4 = L->base + -1;
      do {
        while ((*(int *)(in_RCX + 8) < 0 &&
               (pcVar4 < (cTValue *)((ulong)(uint)-*(int *)(in_RCX + 8) + (L->stack).ptr64)))) {
          in_RCX = *(ulong *)(in_RCX + 0x20) & 0xfffffffffffffffc;
          if (in_RCX == 0) goto LAB_0011419f;
        }
        if (pcVar4 < nextframe) {
          in_RCX = *(ulong *)(in_RCX + 0x18);
          bVar5 = in_RCX == 0;
          goto LAB_00114110;
        }
        uVar3 = pcVar4->u64;
        if (((uint)uVar3 & 3) == 1) {
LAB_0011418b:
          in_RCX = *(ulong *)(in_RCX + 0x20) & 0xfffffffffffffffc;
LAB_00114193:
          pcVar4 = (cTValue *)((long)pcVar4 - (uVar3 & 0xfffffffffffffff8));
        }
        else {
          if ((uVar3 & 3) != 0) {
            if ((((uint)uVar3 & 7) == 2) && (pcVar4[-3].u64 == 1)) goto LAB_0011418b;
            goto LAB_00114193;
          }
          pcVar4 = pcVar4 + (-2 - (ulong)*(byte *)(uVar3 - 3));
        }
      } while (in_RCX != 0);
    }
LAB_0011419f:
    bVar5 = false;
  }
  if (!bVar5) {
    return 0xffffffff;
  }
LAB_001141a9:
  lVar1 = *(long *)((long)fn + 0x20);
  uVar2 = (int)(in_RCX - lVar1 >> 2) - 1;
  if (uVar2 <= *(uint *)(lVar1 + -0x5c)) {
    return uVar2;
  }
  return (BCPos)((ulong)(*(long *)(in_RCX - 0xc) - lVar1) >> 2);
}

Assistant:

static BCPos debug_framepc(lua_State *L, GCfunc *fn, cTValue *nextframe)
{
  const BCIns *ins;
  GCproto *pt;
  BCPos pos;
  lj_assertL(fn->c.gct == ~LJ_TFUNC || fn->c.gct == ~LJ_TTHREAD,
	     "function or frame expected");
  if (!isluafunc(fn)) {  /* Cannot derive a PC for non-Lua functions. */
    return NO_BCPOS;
  } else if (nextframe == NULL) {  /* Lua function on top. */
    void *cf = cframe_raw(L->cframe);
    if (cf == NULL || (char *)cframe_pc(cf) == (char *)cframe_L(cf))
      return NO_BCPOS;
    ins = cframe_pc(cf);  /* Only happens during error/hook handling. */
  } else {
    if (frame_islua(nextframe)) {
      ins = frame_pc(nextframe);
    } else if (frame_iscont(nextframe)) {
      ins = frame_contpc(nextframe);
    } else {
      /* Lua function below errfunc/gc/hook: find cframe to get the PC. */
      void *cf = cframe_raw(L->cframe);
      TValue *f = L->base-1;
      for (;;) {
	if (cf == NULL)
	  return NO_BCPOS;
	while (cframe_nres(cf) < 0) {
	  if (f >= restorestack(L, -cframe_nres(cf)))
	    break;
	  cf = cframe_raw(cframe_prev(cf));
	  if (cf == NULL)
	    return NO_BCPOS;
	}
	if (f < nextframe)
	  break;
	if (frame_islua(f)) {
	  f = frame_prevl(f);
	} else {
	  if (frame_isc(f) || (frame_iscont(f) && frame_iscont_fficb(f)))
	    cf = cframe_raw(cframe_prev(cf));
	  f = frame_prevd(f);
	}
      }
      ins = cframe_pc(cf);
      if (!ins) return NO_BCPOS;
    }
  }
  pt = funcproto(fn);
  pos = proto_bcpos(pt, ins) - 1;
#if LJ_HASJIT
  if (pos > pt->sizebc) {  /* Undo the effects of lj_trace_exit for JLOOP. */
    GCtrace *T = (GCtrace *)((char *)(ins-1) - offsetof(GCtrace, startins));
    lj_assertL(bc_isret(bc_op(ins[-1])), "return bytecode expected");
    pos = proto_bcpos(pt, mref(T->startpc, const BCIns));
  }
#endif
  return pos;
}